

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitPla.c
# Opt level: O3

char * Kit_PlaFromTruth(void *p,uint *pTruth,int nVars,Vec_Int_t *vCover)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  
  uVar3 = (ulong)(uint)(1 << ((char)nVars - 5U & 0x1f));
  uVar4 = uVar3;
  if (nVars < 6) {
    uVar3 = 1;
    uVar4 = uVar3;
  }
  do {
    if ((int)uVar3 < 1) {
      pcVar5 = " 0\n";
      goto LAB_005e2082;
    }
    lVar1 = uVar3 - 1;
    uVar3 = uVar3 - 1;
  } while (pTruth[lVar1] == 0);
  while (0 < (int)uVar4) {
    lVar1 = uVar4 - 1;
    uVar4 = uVar4 - 1;
    if (pTruth[lVar1] != 0xffffffff) {
      uVar2 = Kit_TruthIsop(pTruth,nVars,vCover,0);
      if (1 < uVar2) {
        __assert_fail("RetValue == 0 || RetValue == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitPla.c"
                      ,0x15b,"char *Kit_PlaFromTruth(void *, unsigned int *, int, Vec_Int_t *)");
      }
      pcVar5 = Kit_PlaCreateFromIsop(p,nVars,vCover);
      if (uVar2 != 0) {
        Kit_PlaComplement(pcVar5);
      }
      return pcVar5;
    }
  }
  pcVar5 = " 1\n";
LAB_005e2082:
  pcVar5 = Kit_PlaStoreSop(p,pcVar5);
  return pcVar5;
}

Assistant:

char * Kit_PlaFromTruth( void * p, unsigned * pTruth, int nVars, Vec_Int_t * vCover )
{
    Aig_MmFlex_t * pMan = (Aig_MmFlex_t *)p;
    char * pSop;
    int RetValue;
    if ( Kit_TruthIsConst0(pTruth, nVars) )
        return Kit_PlaStoreSop( pMan, " 0\n" );
    if ( Kit_TruthIsConst1(pTruth, nVars) )
        return Kit_PlaStoreSop( pMan, " 1\n" );
    RetValue = Kit_TruthIsop( pTruth, nVars, vCover, 0 ); // 1 );
    assert( RetValue == 0 || RetValue == 1 );
    pSop = Kit_PlaCreateFromIsop( pMan, nVars, vCover );
    if ( RetValue )
        Kit_PlaComplement( pSop );
    return pSop;
}